

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

float Gia_ManDelayTraceLut(Gia_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  Tim_Man_t *pTVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  int local_4c;
  int iObj;
  int i;
  float tSlack;
  float tRequired;
  float tArrivalCur;
  float tArrival;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObjs;
  If_LibLut_t *pLutLib;
  int fUseSorting;
  Gia_Man_t *p_local;
  
  pvVar2 = p->pLutLib;
  if ((pvVar2 == (void *)0x0) ||
     (iVar6 = *(int *)((long)pvVar2 + 8), iVar4 = Gia_ManLutSizeMax(p), iVar4 <= iVar6)) {
    Gia_ManTimeStart(p);
    Gia_ManLevelNum(p);
    if (p->pManTime != (void *)0x0) {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    }
    local_4c = 0;
    while( true ) {
      bVar8 = false;
      if (local_4c < p->nObjs) {
        _tArrivalCur = Gia_ManObj(p,local_4c);
        bVar8 = _tArrivalCur != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar6 = Gia_ObjIsCi(_tArrivalCur);
      if (((iVar6 != 0) || (iVar6 = Gia_ObjIsCo(_tArrivalCur), iVar6 != 0)) ||
         (iVar6 = Gia_ObjIsLut(p,local_4c), iVar6 != 0)) {
        tRequired = Gia_ObjComputeArrival(p,local_4c,1);
        iVar6 = Gia_ObjIsCi(_tArrivalCur);
        if ((iVar6 != 0) && (p->pManTime != (void *)0x0)) {
          pTVar3 = (Tim_Man_t *)p->pManTime;
          iVar6 = Gia_ObjCioId(_tArrivalCur);
          tRequired = Tim_ManGetCiArrival(pTVar3,iVar6);
        }
        iVar6 = Gia_ObjIsCo(_tArrivalCur);
        if ((iVar6 != 0) && (p->pManTime != (void *)0x0)) {
          pTVar3 = (Tim_Man_t *)p->pManTime;
          iVar6 = Gia_ObjCioId(_tArrivalCur);
          Tim_ManSetCoArrival(pTVar3,iVar6,tRequired);
        }
        Gia_ObjSetTimeArrival(p,local_4c,tRequired);
      }
      local_4c = local_4c + 1;
    }
    tRequired = -1e+09;
    local_4c = 0;
    while( true ) {
      iVar6 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (local_4c < iVar6) {
        _tArrivalCur = Gia_ManCo(p,local_4c);
        bVar8 = _tArrivalCur != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(_tArrivalCur);
      fVar9 = Gia_ObjTimeArrivalObj(p,pGVar7);
      iVar6 = Gia_ObjId(p,_tArrivalCur);
      Gia_ObjSetTimeArrival(p,iVar6,fVar9);
      if (tRequired < fVar9) {
        tRequired = fVar9;
      }
      local_4c = local_4c + 1;
    }
    if (p->pManTime == (void *)0x0) {
      local_4c = 0;
      while( true ) {
        iVar6 = Vec_IntSize(p->vCos);
        bVar8 = false;
        if (local_4c < iVar6) {
          _tArrivalCur = Gia_ManCo(p,local_4c);
          bVar8 = _tArrivalCur != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        Gia_ObjSetTimeRequiredObj(p,_tArrivalCur,tRequired);
        local_4c = local_4c + 1;
      }
    }
    else {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
      Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pManTime,tRequired);
    }
    p_00 = Gia_ManOrderReverse(p);
    for (local_4c = 0; iVar6 = Vec_IntSize(p_00), local_4c < iVar6; local_4c = local_4c + 1) {
      iVar6 = Vec_IntEntry(p_00,local_4c);
      pGVar7 = Gia_ManObj(p,iVar6);
      iVar4 = Gia_ObjIsLut(p,iVar6);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsCi(pGVar7);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsCo(pGVar7);
          if (iVar4 != 0) {
            if (p->pManTime != (void *)0x0) {
              pTVar3 = (Tim_Man_t *)p->pManTime;
              iVar4 = Gia_ObjCioId(pGVar7);
              fVar9 = Tim_ManGetCoRequired(pTVar3,iVar4);
              Gia_ObjSetTimeRequired(p,iVar6,fVar9);
            }
            iVar4 = Gia_ObjFaninId0p(p,pGVar7);
            fVar9 = Gia_ObjTimeRequired(p,iVar4);
            fVar10 = Gia_ObjTimeRequired(p,iVar6);
            if (fVar10 < fVar9) {
              iVar4 = Gia_ObjFaninId0p(p,pGVar7);
              fVar9 = Gia_ObjTimeRequired(p,iVar6);
              Gia_ObjSetTimeRequired(p,iVar4,fVar9);
            }
          }
        }
        else if (p->pManTime != (void *)0x0) {
          pTVar3 = (Tim_Man_t *)p->pManTime;
          iVar4 = Gia_ObjCioId(pGVar7);
          fVar9 = Gia_ObjTimeRequired(p,iVar6);
          Tim_ManSetCiRequired(pTVar3,iVar4,fVar9);
        }
      }
      else {
        Gia_ObjPropagateRequired(p,iVar6,1);
      }
      fVar9 = Gia_ObjTimeRequired(p,iVar6);
      fVar10 = Gia_ObjTimeArrival(p,iVar6);
      fVar9 = fVar9 - fVar10;
      if (fVar9 + 0.01 <= 0.0) {
        __assert_fail("tSlack + 0.01 > 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                      ,0x13e,"float Gia_ManDelayTraceLut(Gia_Man_t *)");
      }
      if (fVar9 < 0.0) {
        fVar9 = 0.0;
      }
      Gia_ObjSetTimeSlack(p,iVar6,fVar9);
    }
    Vec_IntFree(p_00);
    p_local._4_4_ = tRequired;
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 8);
    uVar5 = Gia_ManLutSizeMax(p);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar1,
           (ulong)uVar5);
    p_local._4_4_ = -1e+09;
  }
  return p_local._4_4_;
}

Assistant:

float Gia_ManDelayTraceLut( Gia_Man_t * p )
{
    int fUseSorting = 1;
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    float tArrival, tArrivalCur, tRequired, tSlack;
    int i, iObj;

    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -TIM_ETERNITY;
    }

    // initialize the arrival times
    Gia_ManTimeStart( p );
    Gia_ManLevelNum( p );

    // propagate arrival times
    if ( p->pManTime )
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !Gia_ObjIsCi(pObj) && !Gia_ObjIsCo(pObj) && !Gia_ObjIsLut(p, i) )
            continue;
        tArrival = Gia_ObjComputeArrival( p, i, fUseSorting );
        if ( Gia_ObjIsCi(pObj) && p->pManTime )
        {
            tArrival = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
//printf( "%.3f  ", tArrival );
        }
        if ( Gia_ObjIsCo(pObj) && p->pManTime )
            Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), tArrival );
        Gia_ObjSetTimeArrival( p, i, tArrival );
    }

    // get the latest arrival times
    tArrival = -TIM_ETERNITY;
    Gia_ManForEachCo( p, pObj, i )
    {
        tArrivalCur = Gia_ObjTimeArrivalObj( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetTimeArrival( p, Gia_ObjId(p,pObj), tArrivalCur );
        if ( tArrival < tArrivalCur )
            tArrival = tArrivalCur;
    }

    // initialize the required times
    if ( p->pManTime )
    {
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Tim_ManInitPoRequiredAll( (Tim_Man_t *)p->pManTime, tArrival );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetTimeRequiredObj( p, pObj, tArrival );
    }

    // propagate the required times
    vObjs = Gia_ManOrderReverse( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        pObj = Gia_ManObj(p, iObj);
        if ( Gia_ObjIsLut(p, iObj) )
        {
            Gia_ObjPropagateRequired( p, iObj, fUseSorting );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
                Tim_ManSetCiRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), Gia_ObjTimeRequired(p, iObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( p->pManTime )
            {
                tRequired = Tim_ManGetCoRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
                Gia_ObjSetTimeRequired( p, iObj, tRequired );
            }
            if ( Gia_ObjTimeRequired(p, Gia_ObjFaninId0p(p, pObj)) > Gia_ObjTimeRequired(p, iObj) )
                Gia_ObjSetTimeRequired(p, Gia_ObjFaninId0p(p, pObj), Gia_ObjTimeRequired(p, iObj) );
        }

        // set slack for this object
        tSlack = Gia_ObjTimeRequired(p, iObj) - Gia_ObjTimeArrival(p, iObj);
        assert( tSlack + 0.01 > 0.0 );
        Gia_ObjSetTimeSlack( p, iObj, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_IntFree( vObjs );
    return tArrival;
}